

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

bool __thiscall Image::is_approximately_equal_to(Image *this,Image *other)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Pixel *pPVar5;
  long lVar6;
  ostream *poVar7;
  uint uVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  double err [4];
  undefined4 local_6c;
  double local_68;
  double local_60;
  double local_58 [5];
  
  uVar1 = this->width;
  if ((uVar1 == other->width) && (uVar2 = this->height, uVar2 == other->height)) {
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    if (uVar2 == 0) {
      uVar8 = this->colors;
    }
    else {
      uVar8 = this->colors;
      pPVar5 = this->pixels;
      uVar10 = 0;
      do {
        if ((ulong)uVar1 != 0) {
          uVar11 = 0;
          do {
            if (uVar8 != 0) {
              uVar12 = uVar10 * uVar1 + (int)uVar11;
              uVar3 = *(undefined4 *)pPVar5[uVar12].colors;
              uVar4 = *(undefined4 *)other->pixels[uVar12].colors;
              uVar13 = 0;
              do {
                local_6c = uVar3;
                local_6c = uVar4;
                local_58[uVar13] =
                     ABS((double)*(byte *)((long)&local_6c + uVar13) -
                         (double)*(byte *)((long)&local_6c + uVar13)) + local_58[uVar13];
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar2);
    }
    bVar9 = true;
    if (uVar8 != 0) {
      local_60 = 1.0 / (double)(int)(uVar2 * uVar1);
      uVar11 = 0;
      do {
        local_68 = local_58[uVar11] * local_60;
        if (this->error_threshold <= local_68 && local_68 != this->error_threshold) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Channel ",8);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," error threshold (",0x12);
          poVar7 = std::ostream::_M_insert<double>(this->error_threshold);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") exceeded.",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Average pixel error: ",0x15);
          poVar7 = std::ostream::_M_insert<double>(local_68);
          lVar6 = *(long *)poVar7;
          goto LAB_00110e56;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Channel ",8);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," average pixel error: ",0x16);
        poVar7 = std::ostream::_M_insert<double>(local_68);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->colors);
    }
  }
  else {
    poVar7 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Not approximately equal because dimensions are different.",
               0x39);
    lVar6 = std::cerr;
LAB_00110e56:
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool Image::is_approximately_equal_to(const Image *other) const {
  if ((width != other->width) || (height != other->height)) {
    std::cerr << "Not approximately equal because dimensions are different." << std::endl;
    return false;
  }

  // Calculate the error on each channel
  double err[4] = {0.0};
  for (int y = 0; y < height; y++) {
    for (int x = 0; x < width; x++) {
      for (int c = 0; c < colors; c++) {
        auto this_val = (double) pixel(x, y).colors[c];
        auto that_val = (double) other->pixel(x, y).colors[c];

        err[c] += std::sqrt(std::pow(this_val - that_val, 2));
      }
    }
  }

  int total_pixels = width * height;

  for (int c = 0; c < colors; c++) {
    auto channel_err = err[c] / total_pixels;
    if (channel_err > error_threshold) {
      std::cerr << "Channel " << c << " error threshold (" << error_threshold << ") exceeded."
                << "Average pixel error: " << channel_err << std::endl;
      return false;
    } else {
      std::cout << "Channel " << c << " average pixel error: " << channel_err << std::endl;
    }
  }
  return true;
}